

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O3

int __thiscall
Centaurus::LookaheadDFA<char>::run
          (LookaheadDFA<char> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,int index,
          int input_pos)

{
  byte bVar1;
  pointer pLVar2;
  pointer pNVar3;
  pointer pNVar4;
  Range<char> *mr;
  pointer pRVar5;
  
LAB_0011ca16:
  if (seq->_M_string_length != (long)input_pos) {
    pLVar2 = (this->super_NFABase<Centaurus::LDFAState<char>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar4 = *(pointer *)
              &pLVar2[index].
               super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
               .m_transitions.
               super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ._M_impl;
    pNVar3 = *(pointer *)
              ((long)&pLVar2[index].
                      super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                      .m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              + 8);
    if (pNVar4 != pNVar3) {
      bVar1 = (seq->_M_dataplus)._M_p[input_pos];
      do {
        for (pRVar5 = (pNVar4->m_label).m_ranges.
                      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pRVar5 != *(pointer *)
                       ((long)&(pNVar4->m_label).m_ranges.
                               super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                       + 8); pRVar5 = pRVar5 + 1) {
          if (((byte)pRVar5->m_start <= bVar1) && (bVar1 < (byte)pRVar5->m_end)) {
            index = pNVar4->m_dest;
            if (index < 0) {
              return -index;
            }
            input_pos = input_pos + 1;
            goto LAB_0011ca16;
          }
        }
        pNVar4 = pNVar4 + 1;
      } while (pNVar4 != pNVar3);
    }
  }
  return -1;
}

Assistant:

int run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		if (input_pos == seq.size())
		{
			return -1;
		}
		else
		{
			const LDFAState<TCHAR>& state = m_states[index];

			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					if (tr.dest() < 0)
					{
						return -tr.dest();
					}
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return -1;
		}
	}